

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O2

int mdns_query_send(int sock,mdns_record_type_t type,char *name,size_t length,void *buffer,
                   size_t capacity)

{
  int iVar1;
  ushort *puVar2;
  ssize_t sVar3;
  socklen_t local_c8;
  sockaddr local_c4;
  undefined4 uStack_b4;
  undefined8 local_b0;
  sockaddr_storage addr_storage;
  
  iVar1 = -1;
  if (length + 0x11 <= capacity) {
    mdns_transaction_id = mdns_transaction_id + 1;
    *(uint16_t *)buffer = mdns_transaction_id * 0x100 | mdns_transaction_id >> 8;
    *(undefined8 *)((long)buffer + 2) = 0x1000000;
    *(undefined2 *)((long)buffer + 10) = 0;
    puVar2 = (ushort *)mdns_string_make((void *)((long)buffer + 0xc),capacity - 0x11,name,length);
    if (puVar2 != (ushort *)0x0) {
      *puVar2 = (ushort)type << 8 | (ushort)type >> 8;
      puVar2[1] = 0x180;
      local_c8 = 0x80;
      iVar1 = getsockname(sock,(sockaddr *)&addr_storage,&local_c8);
      if (iVar1 == 0) {
        if (addr_storage.ss_family == 10) {
          local_c4.sa_data[2] = '\0';
          local_c4.sa_data[3] = '\0';
          local_c4.sa_data[4] = '\0';
          local_c4.sa_data[5] = '\0';
          uStack_b4 = 0;
          local_c4.sa_family = 10;
          local_c4.sa_data[6] = -1;
          local_c4.sa_data[7] = '\x02';
          local_b0 = 0xfb000000;
          local_c8 = 0x1c;
        }
        else {
          local_c4.sa_data[6] = '\0';
          local_c4.sa_data[7] = '\0';
          local_c4.sa_family = 2;
          local_c4.sa_data[2] = -0x20;
          local_c4.sa_data[3] = '\0';
          local_c4.sa_data[4] = '\0';
          local_c4.sa_data[5] = -5;
          local_c8 = 0x10;
        }
        local_c4.sa_data[10] = '\0';
        local_c4.sa_data[0xb] = '\0';
        local_c4.sa_data[0xc] = '\0';
        local_c4.sa_data[0xd] = '\0';
        local_c4.sa_data[8] = '\0';
        local_c4.sa_data[9] = '\0';
        local_c4.sa_data[0] = '\x14';
        local_c4.sa_data[1] = -0x17;
        sVar3 = sendto(sock,buffer,(long)puVar2 + (4 - (long)buffer),0,&local_c4,local_c8);
        iVar1 = (int)(sVar3 >> 0x3f);
      }
      else {
        iVar1 = -1;
      }
    }
  }
  return iVar1;
}

Assistant:

int
mdns_query_send(int sock, mdns_record_type_t type, const char* name, size_t length,
                void* buffer, size_t capacity) {
	if (capacity < (17 + length))
		return -1;

	uint16_t* data = (uint16_t*)buffer;
	//Transaction ID
	*data++ = htons(++mdns_transaction_id);
	//Flags
	*data++ = 0;
	//Questions
	*data++ = htons(1);
	//No answer, authority or additional RRs
	*data++ = 0;
	*data++ = 0;
	*data++ = 0;
	//Name string
	data = (uint16_t*)mdns_string_make(data, capacity - 17, name, length);
	if (!data)
		return -1;
	//Record type
	*data++ = htons(type);
	//! Unicast response, class IN
	*data++ = htons(0x8000U | MDNS_CLASS_IN);

	struct sockaddr_storage addr_storage;
	struct sockaddr_in addr;
	struct sockaddr_in6 addr6;
	struct sockaddr* saddr = (struct sockaddr*)&addr_storage;
	socklen_t saddrlen = sizeof(struct sockaddr_storage);
	if (getsockname(sock, saddr, &saddrlen))
		return -1;
	if (saddr->sa_family == AF_INET6) {
		memset(&addr6, 0, sizeof(struct sockaddr_in6));
		addr6.sin6_family = AF_INET6;
#ifdef __APPLE__
		addr6.sin6_len = sizeof(struct sockaddr_in6);
#endif
		addr6.sin6_addr.s6_addr[0] = 0xFF;
		addr6.sin6_addr.s6_addr[1] = 0x02;
		addr6.sin6_addr.s6_addr[15] = 0xFB;
		addr6.sin6_port = htons((unsigned short)5353);
		saddr = (struct sockaddr*)&addr6;
		saddrlen = sizeof(struct sockaddr_in6);
	}
	else {
		memset(&addr, 0, sizeof(struct sockaddr_in));
		addr.sin_family = AF_INET;
#ifdef __APPLE__
		addr.sin_len = sizeof(struct sockaddr_in);
#endif
		addr.sin_addr.s_addr = htonl((((uint32_t)224U) << 24U) | ((uint32_t)251U));
		addr.sin_port = htons((unsigned short)5353);
		saddr = (struct sockaddr*)&addr;
		saddrlen = sizeof(struct sockaddr_in);
	}

	if (sendto(sock, buffer, (char*)data - (char*)buffer, 0,
	           saddr, saddrlen) < 0)
		return -1;
	return 0;
}